

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_traits.h
# Opt level: O2

StatusOr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
google::protobuf::json_internal::Proto3Type::EnumNameByNumber_abi_cxx11_
          (StatusOr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,Proto3Type *this,Field f,int32_t number)

{
  void *pvVar1;
  void **ppvVar2;
  const_iterator cVar3;
  RepeatedPtrField<google::protobuf::EnumValue> *this_00;
  Status _status;
  StatusOr<const_google::protobuf::json_internal::ResolverPool::Enum_*> e;
  Status local_70;
  int local_64;
  string local_60;
  undefined1 local_40 [24];
  void *local_28;
  
  local_64 = (int)f;
  ResolverPool::Field::EnumType((Field *)local_40);
  absl::lts_20240722::Status::Status((Status *)&local_60,(Status *)local_40);
  if (local_60._M_dataplus._M_p == (pointer)0x1) {
    absl::lts_20240722::Status::~Status((Status *)&local_60);
    absl::lts_20240722::internal_statusor::
    StatusOrData<const_google::protobuf::json_internal::ResolverPool::Enum_*>::EnsureOk
              ((StatusOrData<const_google::protobuf::json_internal::ResolverPool::Enum_*> *)local_40
              );
    this_00 = &(((Enum *)(local_40._8_8_ + 8))->field_0)._impl_.enumvalue_;
    ppvVar2 = internal::RepeatedPtrFieldBase::elements(&this_00->super_RepeatedPtrFieldBase);
    cVar3 = RepeatedPtrField<google::protobuf::EnumValue>::end(this_00);
    do {
      if (ppvVar2 == cVar3.it_) {
        local_40._16_8_ = "unknown enum number: \'%d\'";
        local_28 = (void *)0x19;
        absl::lts_20240722::StrFormat<int>(&local_60,(FormatSpec<int> *)(local_40 + 0x10),&local_64)
        ;
        absl::lts_20240722::InvalidArgumentError
                  (&local_70,local_60._M_string_length,local_60._M_dataplus._M_p);
        absl::lts_20240722::internal_statusor::
        StatusOrData<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::StatusOrData<absl::lts_20240722::Status,_0>
                  (&__return_storage_ptr__->
                    super_StatusOrData<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ,&local_70);
        absl::lts_20240722::Status::~Status(&local_70);
        std::__cxx11::string::~string((string *)&local_60);
        goto LAB_002a284b;
      }
      pvVar1 = *ppvVar2;
      ppvVar2 = ppvVar2 + 1;
    } while (*(int *)((long)pvVar1 + 0x30) != (int)f);
    absl::lts_20240722::internal_statusor::StatusOrData<std::__cxx11::string>::
    StatusOrData<std::__cxx11::string_const&>
              ((StatusOrData<std::__cxx11::string> *)__return_storage_ptr__,
               *(ulong *)((long)pvVar1 + 0x28) & 0xfffffffffffffffc);
  }
  else {
    absl::lts_20240722::internal_statusor::
    StatusOrData<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    StatusOrData<const_absl::lts_20240722::Status,_0>
              (&__return_storage_ptr__->
                super_StatusOrData<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ,(Status *)&local_60);
    absl::lts_20240722::Status::~Status((Status *)&local_60);
  }
LAB_002a284b:
  absl::lts_20240722::Status::~Status((Status *)local_40);
  return __return_storage_ptr__;
}

Assistant:

static absl::StatusOr<std::string> EnumNameByNumber(Field f, int32_t number) {
    auto e = f->EnumType();
    RETURN_IF_ERROR(e.status());

    for (const auto& ev : (**e).proto().enumvalue()) {
      if (ev.number() == number) {
        return ev.name();
      }
    }
    return absl::InvalidArgumentError(
        absl::StrFormat("unknown enum number: '%d'", number));
  }